

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O2

void duckdb::roaring::RoaringCompressState::HandleAllValid(RoaringCompressState *state,idx_t amount)

{
  uint16_t amount_00;
  
  amount_00 = (state->container_state).length;
  if ((amount_00 != 0) && ((state->container_state).last_bit_set == false)) {
    ContainerCompressionState::Append(&state->container_state,true,amount_00);
    amount_00 = 0;
  }
  (state->container_state).length = amount_00 + (short)amount;
  (state->container_state).last_bit_set = true;
  return;
}

Assistant:

void RoaringCompressState::HandleAllValid(RoaringCompressState &state, idx_t amount) {
	auto &container_state = state.container_state;
	if (container_state.length && container_state.last_bit_set == false) {
		container_state.Append(!container_state.last_bit_set, container_state.length);
		container_state.length = 0;
	}
	container_state.length += amount;
	container_state.last_bit_set = true;
}